

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_readwrite_headers
                   (Curl_easy *data,connectdata *conn,ssize_t *nread,_Bool *stop_reading)

{
  statusline sVar1;
  ssize_t *psVar2;
  connectdata *pcVar3;
  _Bool _Var4;
  CURLcode CVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  char *local_f8;
  undefined1 local_b0 [7];
  char local_a9;
  int rtspversion;
  int iStack_a4;
  char separator_1;
  statusline check;
  int httpversion;
  undefined1 local_98;
  char twoorthree [2];
  char separator;
  int nc;
  int rtspversion_major;
  int httpversion_major;
  size_t headerlen;
  statusline local_80;
  statusline st_1;
  statusline st;
  int writetype;
  size_t full_length;
  size_t rest_length;
  char *end_ptr;
  char *str_start;
  char *headp;
  char *ostr;
  ssize_t onread;
  SingleRequest *k;
  _Bool *p_Stack_30;
  CURLcode result;
  _Bool *stop_reading_local;
  ssize_t *nread_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  onread = (ssize_t)&data->req;
  ostr = (char *)*nread;
  headp = (data->req).str;
  p_Stack_30 = stop_reading;
  stop_reading_local = (_Bool *)nread;
  nread_local = (ssize_t *)conn;
  conn_local = (connectdata *)data;
  do {
    end_ptr = *(char **)(onread + 0x60);
    rest_length = (size_t)memchr(end_ptr,10,*(size_t *)stop_reading_local);
    if ((void *)rest_length == (void *)0x0) {
      k._4_4_ = Curl_dyn_addn((dynbuf *)(conn_local[2].recv + 1),end_ptr,
                              *(size_t *)stop_reading_local);
      pcVar3 = conn_local;
      psVar2 = nread_local;
      if (k._4_4_ != CURLE_OK) {
        return k._4_4_;
      }
      if (*(int *)(onread + 0x5c) != 0) {
        return CURLE_OK;
      }
      pcVar7 = Curl_dyn_ptr((dynbuf *)(conn_local[2].recv + 1));
      sVar8 = Curl_dyn_len((dynbuf *)(conn_local[2].recv + 1));
      local_80 = checkprotoprefix((Curl_easy *)pcVar3,(connectdata *)psVar2,pcVar7,sVar8);
      if (local_80 != STATUS_BAD) {
        return CURLE_OK;
      }
      *(ushort *)(onread + 0xd8) = *(ushort *)(onread + 0xd8) & 0xfffe;
      *(undefined4 *)(onread + 0x58) = 2;
      Curl_conncontrol((connectdata *)nread_local,2);
      if (((ulong)conn_local[2].fclosesocket >> 0x3c & 1) != 0) {
        return CURLE_OK;
      }
      Curl_failf((Curl_easy *)conn_local,"Received HTTP/0.9 when not allowed");
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    full_length = rest_length + (1 - *(long *)(onread + 0x60));
    *(size_t *)stop_reading_local = *(long *)stop_reading_local - full_length;
    *(size_t *)(onread + 0x60) = rest_length + 1;
    _st = *(long *)(onread + 0x60) - (long)end_ptr;
    k._4_4_ = Curl_dyn_addn((dynbuf *)(conn_local[2].recv + 1),end_ptr,_st);
    pcVar3 = conn_local;
    psVar2 = nread_local;
    if (k._4_4_ != CURLE_OK) {
      return k._4_4_;
    }
    if (*(int *)(onread + 0x5c) == 0) {
      pcVar7 = Curl_dyn_ptr((dynbuf *)(conn_local[2].recv + 1));
      sVar8 = Curl_dyn_len((dynbuf *)(conn_local[2].recv + 1));
      headerlen._4_4_ = checkprotoprefix((Curl_easy *)pcVar3,(connectdata *)psVar2,pcVar7,sVar8);
      if (headerlen._4_4_ == STATUS_BAD) {
        Curl_conncontrol((connectdata *)nread_local,2);
        if (((ulong)conn_local[2].fclosesocket >> 0x3c & 1) == 0) {
          Curl_failf((Curl_easy *)conn_local,"Received HTTP/0.9 when not allowed");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        *(ushort *)(onread + 0xd8) = *(ushort *)(onread + 0xd8) & 0xfffe;
        if (*(long *)stop_reading_local != 0) {
          *(undefined4 *)(onread + 0x58) = 1;
          return CURLE_OK;
        }
        *(undefined4 *)(onread + 0x58) = 2;
        *(char **)stop_reading_local = ostr;
        *(char **)(onread + 0x60) = headp;
        return CURLE_OK;
      }
    }
    str_start = Curl_dyn_ptr((dynbuf *)(conn_local[2].recv + 1));
    if ((*str_start == '\n') || (*str_start == '\r')) {
      if (*str_start == '\r') {
        str_start = str_start + 1;
      }
      if (*str_start == '\n') {
        str_start = str_start + 1;
      }
      if ((*(int *)(onread + 0x70) < 100) || (199 < *(int *)(onread + 0x70))) {
        *(ushort *)(onread + 0xd8) = *(ushort *)(onread + 0xd8) & 0xfffe;
        if ((*(long *)onread == -1) &&
           (((((*(ushort *)(onread + 0xd8) >> 5 & 1) == 0 &&
              ((*(ulong *)((long)nread_local + 0x37c) >> 5 & 1) == 0)) &&
             ((char)nread_local[0x38] == '\v')) &&
            (((*(uint *)(nread_local[0x75] + 0x84) & 0x40000) == 0 &&
             (*(int *)conn_local[3].recv != 5)))))) {
          Curl_infof((Curl_easy *)conn_local,
                     "no chunk, no close, no size. Assume close to signal end");
          Curl_conncontrol((connectdata *)nread_local,2);
        }
      }
      else if (*(int *)(onread + 0x70) == 100) {
        *(ushort *)(onread + 0xd8) = *(ushort *)(onread + 0xd8) & 0xfffe | 1;
        *(undefined4 *)(onread + 0x5c) = 0;
        if (*(int *)(onread + 0x88) != 0) {
          *(undefined4 *)(onread + 0x88) = 0;
          *(uint *)(onread + 0x74) = *(uint *)(onread + 0x74) | 2;
          Curl_expire_done((Curl_easy *)conn_local,EXPIRE_100_TIMEOUT);
        }
      }
      else if (*(int *)(onread + 0x70) == 0x65) {
        if (*(int *)(onread + 0x8c) == 1) {
          Curl_infof((Curl_easy *)conn_local,"Received 101");
          *(undefined4 *)(onread + 0x8c) = 2;
          *(ushort *)(onread + 0xd8) = *(ushort *)(onread + 0xd8) & 0xfffe | 1;
          *(undefined4 *)(onread + 0x5c) = 0;
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        *(ushort *)(onread + 0xd8) = *(ushort *)(onread + 0xd8) & 0xfffe;
      }
      else {
        *(ushort *)(onread + 0xd8) = *(ushort *)(onread + 0xd8) & 0xfffe | 1;
        *(undefined4 *)(onread + 0x5c) = 0;
      }
      if (((*(ulong *)((long)nread_local + 0x37c) >> 5 & 1) != 0) &&
         ((((int)(conn_local->http_proxy).port == 0x191 && ((int)nread_local[0x80] == 2)) ||
          (((int)(conn_local->http_proxy).port == 0x197 &&
           (*(int *)((long)nread_local + 0x404) == 2)))))) {
        Curl_infof((Curl_easy *)conn_local,"Connection closure while negotiating auth (HTTP 1.0?)");
        *(uint *)&conn_local[3].ssl_config.cipher_list13 =
             *(uint *)&conn_local[3].ssl_config.cipher_list13 & 0xffffffdf | 0x20;
      }
      st_1 = STATUS_BAD;
      if (((ulong)conn_local[2].fclosesocket >> 0x19 & 1) != 0) {
        st_1 = STATUS_BAD|STATUS_DONE;
      }
      _rtspversion_major = Curl_dyn_len((dynbuf *)(conn_local[2].recv + 1));
      pcVar3 = conn_local;
      sVar1 = st_1;
      pcVar7 = Curl_dyn_ptr((dynbuf *)(conn_local[2].recv + 1));
      k._4_4_ = Curl_client_write((Curl_easy *)pcVar3,sVar1,pcVar7,_rtspversion_major);
      if (k._4_4_ != CURLE_OK) {
        return k._4_4_;
      }
      conn_local[3].proxy_ssl_config.cipher_list13 =
           conn_local[3].proxy_ssl_config.cipher_list13 + _rtspversion_major;
      (conn_local->socks_proxy).host.name = (conn_local->socks_proxy).host.name + _rtspversion_major
      ;
      _Var4 = http_should_fail((Curl_easy *)conn_local);
      if (_Var4) {
        Curl_failf((Curl_easy *)conn_local,"The requested URL returned error: %d",
                   (ulong)*(uint *)(onread + 0x70));
        return CURLE_HTTP_RETURNED_ERROR;
      }
      if ((*(int *)(onread + 0x70) < 100) || (199 < *(int *)(onread + 0x70))) {
        local_f8 = (char *)0x0;
      }
      else {
        local_f8 = (conn_local->socks_proxy).host.name;
      }
      (conn_local->socks_proxy).host.dispname = local_f8;
      k._4_4_ = Curl_http_auth_act((Curl_easy *)conn_local);
      if (k._4_4_ != CURLE_OK) {
        return k._4_4_;
      }
      if (299 < *(int *)(onread + 0x70)) {
        if (((((*(ulong *)((long)nread_local + 0x37c) >> 0x11 & 1) == 0) &&
             ((*(ulong *)((long)nread_local + 0x37c) >> 5 & 1) == 0)) &&
            ((*(ulong *)((long)nread_local + 0x37c) >> 0x12 & 1) == 0)) &&
           ((*(int *)conn_local[3].recv - 1U < 4 &&
            (Curl_expire_done((Curl_easy *)conn_local,EXPIRE_100_TIMEOUT),
            (*(ushort *)(onread + 0xd8) >> 2 & 1) == 0)))) {
          if ((*(int *)(onread + 0x70) == 0x1a1) &&
             ((*(uint *)&conn_local[3].ssl_config.cipher_list13 >> 8 & 1) != 0)) {
            Curl_infof((Curl_easy *)conn_local,"Got 417 while waiting for a 100");
            *(uint *)&conn_local[3].ssl_config.cipher_list13 =
                 *(uint *)&conn_local[3].ssl_config.cipher_list13 & 0xfffffdff | 0x200;
            pcVar7 = (*Curl_cstrdup)((char *)conn_local[3].recv[1]);
            *(char **)(conn_local->primary_ip + 0x12) = pcVar7;
            Curl_done_sending((Curl_easy *)conn_local,(SingleRequest *)onread);
          }
          else if (((ulong)conn_local[2].fclosesocket >> 0x15 & 1) == 0) {
            Curl_infof((Curl_easy *)conn_local,"HTTP error before end of send, stop sending");
            Curl_conncontrol((connectdata *)nread_local,2);
            CVar5 = Curl_done_sending((Curl_easy *)conn_local,(SingleRequest *)onread);
            if (CVar5 != CURLE_OK) {
              return CVar5;
            }
            *(ushort *)(onread + 0xd8) = *(ushort *)(onread + 0xd8) & 0xfffb | 4;
            if ((*(uint *)&conn_local[3].ssl_config.cipher_list13 >> 8 & 1) != 0) {
              *(undefined4 *)(onread + 0x88) = 3;
            }
            k._4_4_ = CURLE_OK;
          }
          else {
            Curl_infof((Curl_easy *)conn_local,"HTTP error before end of send, keep sending");
            if (*(int *)(onread + 0x88) != 0) {
              *(undefined4 *)(onread + 0x88) = 0;
              *(uint *)(onread + 0x74) = *(uint *)(onread + 0x74) | 2;
            }
          }
        }
        if ((*(ulong *)((long)nread_local + 0x37c) >> 0x12 & 1) != 0) {
          Curl_infof((Curl_easy *)conn_local,"Keep sending data to get tossed away!");
          *(uint *)(onread + 0x74) = *(uint *)(onread + 0x74) | 2;
        }
      }
      if ((*(ushort *)(onread + 0xd8) & 1) == 0) {
        if (((ulong)conn_local[2].fclosesocket >> 0x1c & 1) == 0) {
          if ((((*(uint *)(nread_local[0x75] + 0x84) & 0x40000) == 0) ||
              (conn_local[1].proto.ftpc.count2 != 2)) || (*(ulong *)onread < 0x8000000000000000)) {
            if ((*(ushort *)(onread + 0xd8) >> 5 & 1) != 0) {
              *(undefined8 *)onread = 0xffffffffffffffff;
              *(undefined8 *)(onread + 8) = 0xffffffffffffffff;
            }
          }
          else {
            *p_Stack_30 = true;
          }
        }
        else {
          *p_Stack_30 = true;
        }
        if (*(long *)onread != -1) {
          Curl_pgrsSetDownloadSize((Curl_easy *)conn_local,*(curl_off_t *)onread);
          *(undefined8 *)(onread + 8) = *(undefined8 *)onread;
        }
        if (*(long *)(onread + 8) == 0) {
          *p_Stack_30 = true;
        }
        if ((*p_Stack_30 & 1U) != 0) {
          *(uint *)(onread + 0x74) = *(uint *)(onread + 0x74) & 0xfffffffe;
        }
        Curl_debug((Curl_easy *)conn_local,CURLINFO_HEADER_IN,end_ptr,_rtspversion_major);
        return CURLE_OK;
      }
      Curl_dyn_reset((dynbuf *)(conn_local[2].recv + 1));
    }
    else {
      iVar6 = *(int *)(onread + 0x5c);
      *(int *)(onread + 0x5c) = iVar6 + 1;
      if (iVar6 == 0) {
        httpversion = 0;
        if ((*(uint *)(nread_local[0x75] + 0x84) & 3) == 0) {
          if ((*(uint *)(nread_local[0x75] + 0x84) & 0x40000) != 0) {
            iVar6 = __isoc99_sscanf(str_start," RTSP/%1d.%1d%c%3d",&local_98,local_b0,&local_a9,
                                    onread + 0x70);
            if ((iVar6 == 4) && (local_a9 == ' ')) {
              *(undefined1 *)(nread_local + 0x38) = 0xb;
              httpversion = 4;
            }
            else {
              httpversion = 0;
            }
          }
        }
        else {
          iStack_a4 = 0;
          httpversion = __isoc99_sscanf(str_start," HTTP/%1d.%1d%c%3d",&nc,&stack0xffffffffffffff5c,
                                        (byte *)((long)&check + 3),onread + 0x70);
          if (((httpversion == 1) && (1 < nc)) &&
             (iVar6 = __isoc99_sscanf(str_start," HTTP/%1[23] %d",(byte *)((long)&check + 1),
                                      onread + 0x70), iVar6 == 2)) {
            *(undefined1 *)(nread_local + 0x38) = 0;
            httpversion = 4;
            check._3_1_ = 0x20;
          }
          if ((httpversion == 4) && (check._3_1_ == 0x20)) {
            iStack_a4 = iStack_a4 + nc * 10;
            if (iStack_a4 != 10 && iStack_a4 != 0xb) {
              Curl_failf((Curl_easy *)conn_local,"Unsupported HTTP version (%u.%d) in response",
                         (ulong)(uint)(iStack_a4 / 10),(long)iStack_a4 % 10 & 0xffffffff);
              return CURLE_UNSUPPORTED_PROTOCOL;
            }
            *(char *)(nread_local + 0x38) = (char)iStack_a4;
            if ((*(int *)(onread + 0x8c) == 2) && ((char)nread_local[0x38] != '\x14')) {
              Curl_infof((Curl_easy *)conn_local,"Lying server, not serving HTTP/2");
            }
            if (*(byte *)(nread_local + 0x38) < 0x14) {
              *(undefined4 *)nread_local[0xaa] = 0xffffffff;
              Curl_infof((Curl_easy *)conn_local,"Mark bundle as not supporting multiuse");
            }
          }
          else {
            if (httpversion != 0) {
              Curl_failf((Curl_easy *)conn_local,"Unsupported HTTP version in response");
              return CURLE_UNSUPPORTED_PROTOCOL;
            }
            httpversion = __isoc99_sscanf(str_start," HTTP %3d",onread + 0x70);
            pcVar3 = conn_local;
            *(undefined1 *)(nread_local + 0x38) = 10;
            if (httpversion == 0) {
              pcVar7 = Curl_dyn_ptr((dynbuf *)(conn_local[2].recv + 1));
              sVar8 = Curl_dyn_len((dynbuf *)(conn_local[2].recv + 1));
              rtspversion = checkhttpprefix((Curl_easy *)pcVar3,pcVar7,sVar8);
              if (rtspversion == STATUS_DONE) {
                httpversion = 1;
                *(undefined4 *)(onread + 0x70) = 200;
                *(undefined1 *)(nread_local + 0x38) = 10;
              }
            }
          }
        }
        if (httpversion == 0) {
          *(ushort *)(onread + 0xd8) = *(ushort *)(onread + 0xd8) & 0xfffe;
          return CURLE_OK;
        }
        CVar5 = Curl_http_statusline((Curl_easy *)conn_local,(connectdata *)nread_local);
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
      }
      k._4_4_ = 0;
      k._4_4_ = Curl_http_header((Curl_easy *)conn_local,(connectdata *)nread_local,str_start);
      pcVar3 = conn_local;
      pcVar7 = str_start;
      if (k._4_4_ != CURLE_OK) {
        return k._4_4_;
      }
      st_1 = STATUS_BAD;
      if (((ulong)conn_local[2].fclosesocket >> 0x19 & 1) != 0) {
        st_1 = STATUS_BAD|STATUS_DONE;
      }
      sVar8 = Curl_dyn_len((dynbuf *)(conn_local[2].recv + 1));
      Curl_debug((Curl_easy *)pcVar3,CURLINFO_HEADER_IN,pcVar7,sVar8);
      pcVar3 = conn_local;
      pcVar7 = str_start;
      sVar1 = st_1;
      sVar8 = Curl_dyn_len((dynbuf *)(conn_local[2].recv + 1));
      k._4_4_ = Curl_client_write((Curl_easy *)pcVar3,sVar1,pcVar7,sVar8);
      if (k._4_4_ != CURLE_OK) {
        return k._4_4_;
      }
      sVar8 = Curl_dyn_len((dynbuf *)(conn_local[2].recv + 1));
      conn_local[3].proxy_ssl_config.cipher_list13 =
           conn_local[3].proxy_ssl_config.cipher_list13 + sVar8;
      sVar8 = Curl_dyn_len((dynbuf *)(conn_local[2].recv + 1));
      (conn_local->socks_proxy).host.name = (conn_local->socks_proxy).host.name + sVar8;
      Curl_dyn_reset((dynbuf *)(conn_local[2].recv + 1));
    }
    if (**(char **)(onread + 0x60) == '\0') {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_http_readwrite_headers(struct Curl_easy *data,
                                     struct connectdata *conn,
                                     ssize_t *nread,
                                     bool *stop_reading)
{
  CURLcode result;
  struct SingleRequest *k = &data->req;
  ssize_t onread = *nread;
  char *ostr = k->str;
  char *headp;
  char *str_start;
  char *end_ptr;

  /* header line within buffer loop */
  do {
    size_t rest_length;
    size_t full_length;
    int writetype;

    /* str_start is start of line within buf */
    str_start = k->str;

    /* data is in network encoding so use 0x0a instead of '\n' */
    end_ptr = memchr(str_start, 0x0a, *nread);

    if(!end_ptr) {
      /* Not a complete header line within buffer, append the data to
         the end of the headerbuff. */
      result = Curl_dyn_addn(&data->state.headerb, str_start, *nread);
      if(result)
        return result;

      if(!k->headerline) {
        /* check if this looks like a protocol header */
        statusline st =
          checkprotoprefix(data, conn,
                           Curl_dyn_ptr(&data->state.headerb),
                           Curl_dyn_len(&data->state.headerb));

        if(st == STATUS_BAD) {
          /* this is not the beginning of a protocol first header line */
          k->header = FALSE;
          k->badheader = HEADER_ALLBAD;
          streamclose(conn, "bad HTTP: No end-of-message indicator");
          if(!data->set.http09_allowed) {
            failf(data, "Received HTTP/0.9 when not allowed");
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          break;
        }
      }

      break; /* read more and try again */
    }

    /* decrease the size of the remaining (supposed) header line */
    rest_length = (end_ptr - k->str) + 1;
    *nread -= (ssize_t)rest_length;

    k->str = end_ptr + 1; /* move past new line */

    full_length = k->str - str_start;

    result = Curl_dyn_addn(&data->state.headerb, str_start, full_length);
    if(result)
      return result;

    /****
     * We now have a FULL header line in 'headerb'.
     *****/

    if(!k->headerline) {
      /* the first read header */
      statusline st = checkprotoprefix(data, conn,
                                       Curl_dyn_ptr(&data->state.headerb),
                                       Curl_dyn_len(&data->state.headerb));
      if(st == STATUS_BAD) {
        streamclose(conn, "bad HTTP: No end-of-message indicator");
        /* this is not the beginning of a protocol first header line */
        if(!data->set.http09_allowed) {
          failf(data, "Received HTTP/0.9 when not allowed");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        k->header = FALSE;
        if(*nread)
          /* since there's more, this is a partial bad header */
          k->badheader = HEADER_PARTHEADER;
        else {
          /* this was all we read so it's all a bad header */
          k->badheader = HEADER_ALLBAD;
          *nread = onread;
          k->str = ostr;
          return CURLE_OK;
        }
        break;
      }
    }

    /* headers are in network encoding so use 0x0a and 0x0d instead of '\n'
       and '\r' */
    headp = Curl_dyn_ptr(&data->state.headerb);
    if((0x0a == *headp) || (0x0d == *headp)) {
      size_t headerlen;
      /* Zero-length header line means end of headers! */

#ifdef CURL_DOES_CONVERSIONS
      if(0x0d == *headp) {
        *headp = '\r'; /* replace with CR in host encoding */
        headp++;       /* pass the CR byte */
      }
      if(0x0a == *headp) {
        *headp = '\n'; /* replace with LF in host encoding */
        headp++;       /* pass the LF byte */
      }
#else
      if('\r' == *headp)
        headp++; /* pass the \r byte */
      if('\n' == *headp)
        headp++; /* pass the \n byte */
#endif /* CURL_DOES_CONVERSIONS */

      if(100 <= k->httpcode && 199 >= k->httpcode) {
        /* "A user agent MAY ignore unexpected 1xx status responses." */
        switch(k->httpcode) {
        case 100:
          /*
           * We have made a HTTP PUT or POST and this is 1.1-lingo
           * that tells us that the server is OK with this and ready
           * to receive the data.
           * However, we'll get more headers now so we must get
           * back into the header-parsing state!
           */
          k->header = TRUE;
          k->headerline = 0; /* restart the header line counter */

          /* if we did wait for this do enable write now! */
          if(k->exp100 > EXP100_SEND_DATA) {
            k->exp100 = EXP100_SEND_DATA;
            k->keepon |= KEEP_SEND;
            Curl_expire_done(data, EXPIRE_100_TIMEOUT);
          }
          break;
        case 101:
          /* Switching Protocols */
          if(k->upgr101 == UPGR101_REQUESTED) {
            /* Switching to HTTP/2 */
            infof(data, "Received 101");
            k->upgr101 = UPGR101_RECEIVED;

            /* we'll get more headers (HTTP/2 response) */
            k->header = TRUE;
            k->headerline = 0; /* restart the header line counter */

            /* switch to http2 now. The bytes after response headers
               are also processed here, otherwise they are lost. */
            result = Curl_http2_switched(data, k->str, *nread);
            if(result)
              return result;
            *nread = 0;
          }
          else {
            /* Switching to another protocol (e.g. WebSocket) */
            k->header = FALSE; /* no more header to parse! */
          }
          break;
        default:
          /* the status code 1xx indicates a provisional response, so
             we'll get another set of headers */
          k->header = TRUE;
          k->headerline = 0; /* restart the header line counter */
          break;
        }
      }
      else {
        k->header = FALSE; /* no more header to parse! */

        if((k->size == -1) && !k->chunk && !conn->bits.close &&
           (conn->httpversion == 11) &&
           !(conn->handler->protocol & CURLPROTO_RTSP) &&
           data->state.httpreq != HTTPREQ_HEAD) {
          /* On HTTP 1.1, when connection is not to get closed, but no
             Content-Length nor Transfer-Encoding chunked have been
             received, according to RFC2616 section 4.4 point 5, we
             assume that the server will close the connection to
             signal the end of the document. */
          infof(data, "no chunk, no close, no size. Assume close to "
                "signal end");
          streamclose(conn, "HTTP: No end-of-message indicator");
        }
      }

      /* At this point we have some idea about the fate of the connection.
         If we are closing the connection it may result auth failure. */
#if defined(USE_NTLM)
      if(conn->bits.close &&
         (((data->req.httpcode == 401) &&
           (conn->http_ntlm_state == NTLMSTATE_TYPE2)) ||
          ((data->req.httpcode == 407) &&
           (conn->proxy_ntlm_state == NTLMSTATE_TYPE2)))) {
        infof(data, "Connection closure while negotiating auth (HTTP 1.0?)");
        data->state.authproblem = TRUE;
      }
#endif
#if defined(USE_SPNEGO)
      if(conn->bits.close &&
        (((data->req.httpcode == 401) &&
          (conn->http_negotiate_state == GSS_AUTHRECV)) ||
         ((data->req.httpcode == 407) &&
          (conn->proxy_negotiate_state == GSS_AUTHRECV)))) {
        infof(data, "Connection closure while negotiating auth (HTTP 1.0?)");
        data->state.authproblem = TRUE;
      }
      if((conn->http_negotiate_state == GSS_AUTHDONE) &&
         (data->req.httpcode != 401)) {
        conn->http_negotiate_state = GSS_AUTHSUCC;
      }
      if((conn->proxy_negotiate_state == GSS_AUTHDONE) &&
         (data->req.httpcode != 407)) {
        conn->proxy_negotiate_state = GSS_AUTHSUCC;
      }
#endif

      /* now, only output this if the header AND body are requested:
       */
      writetype = CLIENTWRITE_HEADER;
      if(data->set.include_header)
        writetype |= CLIENTWRITE_BODY;

      headerlen = Curl_dyn_len(&data->state.headerb);
      result = Curl_client_write(data, writetype,
                                 Curl_dyn_ptr(&data->state.headerb),
                                 headerlen);
      if(result)
        return result;

      data->info.header_size += (long)headerlen;
      data->req.headerbytecount += (long)headerlen;

      /*
       * When all the headers have been parsed, see if we should give
       * up and return an error.
       */
      if(http_should_fail(data)) {
        failf(data, "The requested URL returned error: %d",
              k->httpcode);
        return CURLE_HTTP_RETURNED_ERROR;
      }

      data->req.deductheadercount =
        (100 <= k->httpcode && 199 >= k->httpcode)?data->req.headerbytecount:0;

      /* Curl_http_auth_act() checks what authentication methods
       * that are available and decides which one (if any) to
       * use. It will set 'newurl' if an auth method was picked. */
      result = Curl_http_auth_act(data);

      if(result)
        return result;

      if(k->httpcode >= 300) {
        if((!conn->bits.authneg) && !conn->bits.close &&
           !conn->bits.rewindaftersend) {
          /*
           * General treatment of errors when about to send data. Including :
           * "417 Expectation Failed", while waiting for 100-continue.
           *
           * The check for close above is done simply because of something
           * else has already deemed the connection to get closed then
           * something else should've considered the big picture and we
           * avoid this check.
           *
           * rewindaftersend indicates that something has told libcurl to
           * continue sending even if it gets discarded
           */

          switch(data->state.httpreq) {
          case HTTPREQ_PUT:
          case HTTPREQ_POST:
          case HTTPREQ_POST_FORM:
          case HTTPREQ_POST_MIME:
            /* We got an error response. If this happened before the whole
             * request body has been sent we stop sending and mark the
             * connection for closure after we've read the entire response.
             */
            Curl_expire_done(data, EXPIRE_100_TIMEOUT);
            if(!k->upload_done) {
              if((k->httpcode == 417) && data->state.expect100header) {
                /* 417 Expectation Failed - try again without the Expect
                   header */
                infof(data, "Got 417 while waiting for a 100");
                data->state.disableexpect = TRUE;
                DEBUGASSERT(!data->req.newurl);
                data->req.newurl = strdup(data->state.url);
                Curl_done_sending(data, k);
              }
              else if(data->set.http_keep_sending_on_error) {
                infof(data, "HTTP error before end of send, keep sending");
                if(k->exp100 > EXP100_SEND_DATA) {
                  k->exp100 = EXP100_SEND_DATA;
                  k->keepon |= KEEP_SEND;
                }
              }
              else {
                infof(data, "HTTP error before end of send, stop sending");
                streamclose(conn, "Stop sending data before everything sent");
                result = Curl_done_sending(data, k);
                if(result)
                  return result;
                k->upload_done = TRUE;
                if(data->state.expect100header)
                  k->exp100 = EXP100_FAILED;
              }
            }
            break;

          default: /* default label present to avoid compiler warnings */
            break;
          }
        }

        if(conn->bits.rewindaftersend) {
          /* We rewind after a complete send, so thus we continue
             sending now */
          infof(data, "Keep sending data to get tossed away!");
          k->keepon |= KEEP_SEND;
        }
      }

      if(!k->header) {
        /*
         * really end-of-headers.
         *
         * If we requested a "no body", this is a good time to get
         * out and return home.
         */
        if(data->set.opt_no_body)
          *stop_reading = TRUE;
#ifndef CURL_DISABLE_RTSP
        else if((conn->handler->protocol & CURLPROTO_RTSP) &&
                (data->set.rtspreq == RTSPREQ_DESCRIBE) &&
                (k->size <= -1))
          /* Respect section 4.4 of rfc2326: If the Content-Length header is
             absent, a length 0 must be assumed.  It will prevent libcurl from
             hanging on DESCRIBE request that got refused for whatever
             reason */
          *stop_reading = TRUE;
#endif
        else {
          /* If we know the expected size of this document, we set the
             maximum download size to the size of the expected
             document or else, we won't know when to stop reading!

             Note that we set the download maximum even if we read a
             "Connection: close" header, to make sure that
             "Content-Length: 0" still prevents us from attempting to
             read the (missing) response-body.
          */
          /* According to RFC2616 section 4.4, we MUST ignore
             Content-Length: headers if we are now receiving data
             using chunked Transfer-Encoding.
          */
          if(k->chunk)
            k->maxdownload = k->size = -1;
        }
        if(-1 != k->size) {
          /* We do this operation even if no_body is true, since this
             data might be retrieved later with curl_easy_getinfo()
             and its CURLINFO_CONTENT_LENGTH_DOWNLOAD option. */

          Curl_pgrsSetDownloadSize(data, k->size);
          k->maxdownload = k->size;
        }

        /* If max download size is *zero* (nothing) we already have
           nothing and can safely return ok now!  But for HTTP/2, we'd
           like to call http2_handle_stream_close to properly close a
           stream.  In order to do this, we keep reading until we
           close the stream. */
        if(0 == k->maxdownload
#if defined(USE_NGHTTP2)
           && !((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
                conn->httpversion == 20)
#endif
           )
          *stop_reading = TRUE;

        if(*stop_reading) {
          /* we make sure that this socket isn't read more now */
          k->keepon &= ~KEEP_RECV;
        }

        Curl_debug(data, CURLINFO_HEADER_IN, str_start, headerlen);
        break; /* exit header line loop */
      }

      /* We continue reading headers, reset the line-based header */
      Curl_dyn_reset(&data->state.headerb);
      continue;
    }

    /*
     * Checks for special headers coming up.
     */

    if(!k->headerline++) {
      /* This is the first header, it MUST be the error code line
         or else we consider this to be the body right away! */
      int httpversion_major;
      int rtspversion_major;
      int nc = 0;
#ifdef CURL_DOES_CONVERSIONS
#define HEADER1 scratch
#define SCRATCHSIZE 21
      CURLcode res;
      char scratch[SCRATCHSIZE + 1]; /* "HTTP/major.minor 123" */
      /* We can't really convert this yet because we don't know if it's the
         1st header line or the body.  So we do a partial conversion into a
         scratch area, leaving the data at 'headp' as-is.
      */
      strncpy(&scratch[0], headp, SCRATCHSIZE);
      scratch[SCRATCHSIZE] = 0; /* null terminate */
      res = Curl_convert_from_network(data,
                                      &scratch[0],
                                      SCRATCHSIZE);
      if(res)
        /* Curl_convert_from_network calls failf if unsuccessful */
        return res;
#else
#define HEADER1 headp /* no conversion needed, just use headp */
#endif /* CURL_DOES_CONVERSIONS */

      if(conn->handler->protocol & PROTO_FAMILY_HTTP) {
        /*
         * https://tools.ietf.org/html/rfc7230#section-3.1.2
         *
         * The response code is always a three-digit number in HTTP as the spec
         * says. We try to allow any number here, but we cannot make
         * guarantees on future behaviors since it isn't within the protocol.
         */
        char separator;
        char twoorthree[2];
        int httpversion = 0;
        nc = sscanf(HEADER1,
                    " HTTP/%1d.%1d%c%3d",
                    &httpversion_major,
                    &httpversion,
                    &separator,
                    &k->httpcode);

        if(nc == 1 && httpversion_major >= 2 &&
           2 == sscanf(HEADER1, " HTTP/%1[23] %d", twoorthree, &k->httpcode)) {
          conn->httpversion = 0;
          nc = 4;
          separator = ' ';
        }

        if((nc == 4) && (' ' == separator)) {
          httpversion += 10 * httpversion_major;
          switch(httpversion) {
          case 10:
          case 11:
#if defined(USE_NGHTTP2) || defined(USE_HYPER)
          case 20:
#endif
#if defined(ENABLE_QUIC)
          case 30:
#endif
            conn->httpversion = (unsigned char)httpversion;
            break;
          default:
            failf(data, "Unsupported HTTP version (%u.%d) in response",
                  httpversion/10, httpversion%10);
            return CURLE_UNSUPPORTED_PROTOCOL;
          }

          if(k->upgr101 == UPGR101_RECEIVED) {
            /* supposedly upgraded to http2 now */
            if(conn->httpversion != 20)
              infof(data, "Lying server, not serving HTTP/2");
          }
          if(conn->httpversion < 20) {
            conn->bundle->multiuse = BUNDLE_NO_MULTIUSE;
            infof(data, "Mark bundle as not supporting multiuse");
          }
        }
        else if(!nc) {
          /* this is the real world, not a Nirvana
             NCSA 1.5.x returns this crap when asked for HTTP/1.1
          */
          nc = sscanf(HEADER1, " HTTP %3d", &k->httpcode);
          conn->httpversion = 10;

          /* If user has set option HTTP200ALIASES,
             compare header line against list of aliases
          */
          if(!nc) {
            statusline check =
              checkhttpprefix(data,
                              Curl_dyn_ptr(&data->state.headerb),
                              Curl_dyn_len(&data->state.headerb));
            if(check == STATUS_DONE) {
              nc = 1;
              k->httpcode = 200;
              conn->httpversion = 10;
            }
          }
        }
        else {
          failf(data, "Unsupported HTTP version in response");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
      }
      else if(conn->handler->protocol & CURLPROTO_RTSP) {
        char separator;
        int rtspversion;
        nc = sscanf(HEADER1,
                    " RTSP/%1d.%1d%c%3d",
                    &rtspversion_major,
                    &rtspversion,
                    &separator,
                    &k->httpcode);
        if((nc == 4) && (' ' == separator)) {
          conn->httpversion = 11; /* For us, RTSP acts like HTTP 1.1 */
        }
        else {
          nc = 0;
        }
      }

      if(nc) {
        result = Curl_http_statusline(data, conn);
        if(result)
          return result;
      }
      else {
        k->header = FALSE;   /* this is not a header line */
        break;
      }
    }

    result = Curl_convert_from_network(data, headp, strlen(headp));
    /* Curl_convert_from_network calls failf if unsuccessful */
    if(result)
      return result;

    result = Curl_http_header(data, conn, headp);
    if(result)
      return result;

    /*
     * End of header-checks. Write them to the client.
     */

    writetype = CLIENTWRITE_HEADER;
    if(data->set.include_header)
      writetype |= CLIENTWRITE_BODY;

    Curl_debug(data, CURLINFO_HEADER_IN, headp,
               Curl_dyn_len(&data->state.headerb));

    result = Curl_client_write(data, writetype, headp,
                               Curl_dyn_len(&data->state.headerb));
    if(result)
      return result;

    data->info.header_size += Curl_dyn_len(&data->state.headerb);
    data->req.headerbytecount += Curl_dyn_len(&data->state.headerb);

    Curl_dyn_reset(&data->state.headerb);
  }
  while(*k->str); /* header line within buffer */

  /* We might have reached the end of the header part here, but
     there might be a non-header part left in the end of the read
     buffer. */

  return CURLE_OK;
}